

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

char * get_line(void)

{
  char cVar1;
  byte bVar2;
  ifdef_state *piVar3;
  file_info *pfVar4;
  byte *pbVar5;
  int iVar6;
  ulong uVar7;
  ifdef_state *piVar8;
  size_t sVar9;
  char *pcVar10;
  ushort **ppuVar11;
  byte *pbVar12;
  char *pcVar13;
  void *t1;
  long lVar14;
  char **ppcVar15;
  char var_name [80];
  
LAB_001120bf:
  do {
    while( true ) {
      while( true ) {
        while ((saw_eof != '\0' || (iVar6 = getc((FILE *)input_file->file), iVar6 == -1))) {
          pfVar4 = input_file;
          piVar8 = ifdef;
          if (input_file->next == (file_info *)0x0) {
            free(line);
            cptr = (char *)0x0;
            line = (char *)0x0;
            saw_eof = '\x01';
            return (char *)0x0;
          }
          while ((piVar8 != (ifdef_state *)0x0 && (piVar8->file == input_file))) {
            error(piVar8->lineno,(char *)0x0,(char *)0x0,"No %%endif for %%if");
            piVar3 = ifdef->next;
            ifdef = piVar3;
            free(piVar8);
            piVar8 = piVar3;
          }
          fclose((FILE *)input_file->file);
          free(input_file->name);
          input_file = input_file->next;
          free(pfVar4);
        }
        if ((line == (char *)0x0) || (linesize != 0x65)) {
          free(line);
          linesize = 0x65;
          line = (char *)malloc(0x65);
          if (line == (char *)0x0) {
            no_space();
          }
        }
        input_file->lineno = input_file->lineno + 1;
        lVar14 = 0;
        while (line[lVar14] = (char)iVar6, (char)iVar6 != '\n') {
          if (linesize <= (int)lVar14 + 2) {
            linesize = linesize + 100;
            line = (char *)realloc(line,(ulong)(uint)linesize);
            if (line == (char *)0x0) {
              no_space();
            }
          }
          iVar6 = getc((FILE *)input_file->file);
          if (iVar6 == -1) {
            saw_eof = '\x01';
            iVar6 = 10;
          }
          lVar14 = lVar14 + 1;
        }
        line[lVar14 + 1] = '\0';
        pcVar10 = line;
        iVar6 = strncmp(line,"%ifdef ",7);
        if ((iVar6 == 0) || (iVar6 = strncmp(pcVar10,"%ifndef ",8), iVar6 == 0)) break;
        iVar6 = strncmp(pcVar10,"%endif",6);
        piVar8 = ifdef;
        if (iVar6 == 0) {
          if ((ifdef == (ifdef_state *)0x0) || (ifdef->file != input_file)) {
            error(input_file->lineno,(char *)0x0,(char *)0x0,
                  "There is no corresponding %%ifdef for %%endif");
          }
          else if (ifdef->nested == 0) {
            ifdef = ifdef->next;
            free(piVar8);
          }
          else {
            ifdef->nested = ifdef->nested + -1;
          }
        }
        else if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) {
          iVar6 = strncmp(pcVar10,"%include ",9);
          if (iVar6 == 0) {
            ppuVar11 = __ctype_b_loc();
            pcVar13 = pcVar10 + 8;
            pbVar5 = (byte *)(pcVar10 + 10);
            do {
              pbVar12 = pbVar5;
              uVar7 = (ulong)pcVar13[1];
              pcVar13 = pcVar13 + 1;
              pbVar5 = pbVar12 + 1;
            } while ((*(byte *)((long)*ppuVar11 + uVar7 * 2 + 1) & 0x20) != 0);
            while (((char)uVar7 != '\n' && (((uint)uVar7 & 0xff) != 0x20))) {
              bVar2 = *pbVar12;
              pbVar12 = pbVar12 + 1;
              uVar7 = (ulong)bVar2;
            }
            pbVar12[-1] = 0;
            read_from_file(pcVar13);
          }
          else {
            iVar6 = strncmp(pcVar10,"%define ",8);
            if (iVar6 != 0) {
              if (Eflag == 0) {
                cptr = pcVar10;
                return pcVar10;
              }
              printf("YPP: %s",pcVar10);
              cptr = line;
              return line;
            }
            for (uVar7 = 0; (cVar1 = pcVar10[uVar7 + 8], cVar1 != '\n' && (cVar1 != ' '));
                uVar7 = uVar7 + 1) {
              var_name[uVar7] = cVar1;
            }
            var_name[uVar7 & 0xffffffff] = '\0';
            for (ppcVar15 = defd_vars; *ppcVar15 != (char *)0x0; ppcVar15 = ppcVar15 + 1) {
              iVar6 = strcmp(*ppcVar15,var_name);
              if (iVar6 == 0) {
                error(input_file->lineno,(char *)0x0,(char *)0x0,
                      "Preprocessor variable %s already defined",var_name);
              }
            }
            sVar9 = strlen(var_name);
            pcVar10 = (char *)malloc((ulong)((int)sVar9 + 1));
            *ppcVar15 = pcVar10;
            strcpy(pcVar10,var_name);
            ppcVar15[1] = (char *)0x0;
          }
        }
      }
      ppuVar11 = __ctype_b_loc();
      pcVar13 = pcVar10 + 6;
      pbVar5 = (byte *)(pcVar10 + 8);
      do {
        pbVar12 = pbVar5;
        uVar7 = (ulong)pcVar13[1];
        pcVar13 = pcVar13 + 1;
        pbVar5 = pbVar12 + 1;
      } while ((*(byte *)((long)*ppuVar11 + uVar7 * 2 + 1) & 0x20) != 0);
      while (((char)uVar7 != '\n' && (((uint)uVar7 & 0xff) != 0x20))) {
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        uVar7 = (ulong)bVar2;
      }
      pbVar12[-1] = 0;
      if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) break;
      ifdef->nested = ifdef->nested + 1;
    }
    piVar8 = (ifdef_state *)allocate(0x20);
    piVar8->next = ifdef;
    pfVar4 = input_file;
    piVar8->file = input_file;
    piVar8->lineno = pfVar4->lineno;
    cVar1 = line[3];
    piVar8->state = (uint)(cVar1 != 'n');
    piVar8->nested = 0;
    ppcVar15 = defd_vars;
    ifdef = piVar8;
    do {
      if (*ppcVar15 == (char *)0x0) goto LAB_001120bf;
      iVar6 = strcmp(*ppcVar15,pcVar13);
      ppcVar15 = ppcVar15 + 1;
    } while (iVar6 != 0);
    piVar8->state = cVar1 != 'n' ^ 1;
  } while( true );
}

Assistant:

char *get_line() {
  extern int Eflag;
  int c;
  int i;

 NextLine:;
  i = 0;

  if (saw_eof || (c = getc(input_file->file)) == EOF) {

    /* end of current file */
    if (input_file->next) {
      void *t = input_file;
      while (ifdef && ifdef->file == input_file) {
	void *t1 = ifdef;
	error(ifdef->lineno, 0, 0, "No %%endif for %%if");
	ifdef = ifdef->next;
	FREE(t1); }
      fclose(input_file->file);
      FREE(input_file->name);
      input_file = input_file->next;
      FREE(t);
      goto NextLine;
    }

    if (line) FREE(line);
    saw_eof = 1;
    return line = cptr = 0;
  }
  if (line == 0 || linesize != (LINESIZE + 1)) {
    if (line) FREE(line);
    linesize = LINESIZE + 1;
    if (!(line = MALLOC(linesize))) no_space();
  }
  ++input_file->lineno;
  while ((line[i] = c) != '\n') {
    if (++i + 1 >= linesize)
      if (!(line = REALLOC(line, linesize += LINESIZE)))
	no_space();
    if ((c = getc(input_file->file)) == EOF) {
      c = '\n';
      saw_eof = 1;
    }
  }
  line[i+1] = 0;

  /* VM: process %ifdef/%ifndef line */
  if (!strncmp(&line[0], "%ifdef ", 7) || !strncmp(&line[0], "%ifndef ", 8)) {
    char *var_name = line + 7;
    char **ps;
    while (isspace(*var_name)) var_name++;
    for(i=0; var_name[i]!='\n' && var_name[i]!=' '; i++);
    var_name[i] = 0;
    if (ifdef && ifdef->state) {
      ifdef->nested++;
    } else {
      struct ifdef_state *n = NEW(struct ifdef_state);
      n->next = ifdef;
      n->file = input_file;
      n->lineno = input_file->lineno;
      n->state = line[3] != 'n';
      n->nested = 0;
      ifdef = n;
      /* Find the preprocessor variable */
      for(ps=&defd_vars[0]; *ps; ps++) {
	if(strcmp(*ps,var_name)==0) {
	  n->state ^= 1;
	  break;
	}
      }
    }
    goto NextLine;
  }

  /* VM: process %endif line */
  if(strncmp(&line[0], "%endif", 6)==0) {
    if(!ifdef || ifdef->file != input_file) {
      error(input_file->lineno, 0, 0, "There is no corresponding %%ifdef for %%endif");
    } else {
      if (ifdef->nested)
	ifdef->nested--;
      else {
	void *t = ifdef;
	ifdef = ifdef->next;
	FREE(t);
      }
    }
    goto NextLine;
  }

  /* VM: skip ordinary lines if ordered by %endif */
  if (ifdef && ifdef->state) {
    goto NextLine;
  }

  /* VM: Process %include line */
  if(strncmp(&line[0], "%include ", 9)==0) {
    char *name = line+9;
    while (isspace(*name)) name++;
    for(i=0; name[i]!='\n' && name[i]!=' '; i++);
    name[i] = 0;
    read_from_file(name);
    goto NextLine;
  }

  /* VM: process %define line */
  if(strncmp(&line[0], "%define ", 8)==0) {
    char var_name[80];
    int ii=0;
    char **ps;
    for(i=8; line[i]!='\n' && line[i]!=' '; i++, ii++) {
      var_name[ii] = line[i];
    }
    var_name[ii] = 0;
    /* Find the preprocessor variable */
    for(ps=&defd_vars[0]; *ps; ps++) {
      if(strcmp(*ps,var_name)==0) {
	error(input_file->lineno, 0, 0, "Preprocessor variable %s already defined", var_name);
      }
    }
    *ps = MALLOC(strlen(var_name)+1);
    strcpy(*ps, var_name);
    *++ps = NULL;
    goto NextLine;
  }

  if(Eflag) {
    printf("YPP: %s", line);
  }

  return cptr = line;
}